

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_fp_compare(DisasContext_conflict1 *s,int size,uint rn,uint rm,_Bool cmp_with_zero,
                      _Bool signal_all_nans)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *ts;
  TCGTemp *pTVar1;
  TCGv_ptr pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  code *func;
  uintptr_t o;
  TCGv_i32 tcg_dest;
  uintptr_t o_1;
  TCGv_i64 tcg_rt;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGv_ptr local_58;
  TCGTemp *local_48;
  TCGv_i32 local_40;
  TCGv_ptr local_38;
  
  s_00 = s->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_rt = (TCGv_i64)((long)pTVar1 - (long)s_00);
  pTVar2 = get_fpstatus_ptr_aarch64(s_00,size == 1);
  if (size == 3) {
    pTVar3 = read_fp_dreg(s,rn);
    if (cmp_with_zero) {
      pTVar4 = tcg_const_i64_aarch64(s_00,0);
    }
    else {
      pTVar4 = read_fp_dreg(s,rm);
    }
    local_68 = (TCGTemp *)(pTVar3 + (long)s_00);
    local_60 = (TCGTemp *)(pTVar4 + (long)s_00);
    local_58 = pTVar2 + (long)&s_00->pool_cur;
    if (signal_all_nans) {
      func = helper_vfp_cmped_a64_aarch64;
    }
    else {
      func = helper_vfp_cmpd_a64_aarch64;
    }
  }
  else {
    local_38 = pTVar2;
    pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    local_48 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    tcg_dest = (TCGv_i32)((long)local_48 - (long)s_00);
    local_40 = (TCGv_i32)((long)pTVar1 - (long)s_00);
    read_vec_element_i32(s,(TCGv_i32)((long)pTVar1 - (long)s_00),rn,0,size);
    if (cmp_with_zero) {
      tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i32,(TCGArg)local_48,0);
    }
    else {
      read_vec_element_i32(s,tcg_dest,rm,0,size);
    }
    local_68 = (TCGTemp *)(local_40 + (long)s_00);
    local_60 = (TCGTemp *)(tcg_dest + (long)s_00);
    local_58 = local_38 + (long)&s_00->pool_cur;
    pTVar2 = local_38;
    if (size == 2) {
      if (signal_all_nans) {
        func = helper_vfp_cmpes_a64_aarch64;
      }
      else {
        func = helper_vfp_cmps_a64_aarch64;
      }
    }
    else if (signal_all_nans) {
      func = helper_vfp_cmpeh_a64_aarch64;
    }
    else {
      func = helper_vfp_cmph_a64_aarch64;
    }
  }
  ts = local_60;
  pTVar1 = local_68;
  tcg_gen_callN_aarch64(s_00,func,(TCGTemp *)((long)s_00 + (long)tcg_rt),3,&local_68);
  tcg_temp_free_internal_aarch64(s_00,pTVar1);
  tcg_temp_free_internal_aarch64(s_00,ts);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar2 + (long)s_00));
  gen_set_nzcv(s_00,tcg_rt);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_rt + (long)s_00));
  return;
}

Assistant:

static void handle_fp_compare(DisasContext *s, int size,
                              unsigned int rn, unsigned int rm,
                              bool cmp_with_zero, bool signal_all_nans)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tcg_flags = tcg_temp_new_i64(tcg_ctx);
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, size == MO_16);

    if (size == MO_64) {
        TCGv_i64 tcg_vn, tcg_vm;

        tcg_vn = read_fp_dreg(s, rn);
        if (cmp_with_zero) {
            tcg_vm = tcg_const_i64(tcg_ctx, 0);
        } else {
            tcg_vm = read_fp_dreg(s, rm);
        }
        if (signal_all_nans) {
            gen_helper_vfp_cmped_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
        } else {
            gen_helper_vfp_cmpd_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_vn);
        tcg_temp_free_i64(tcg_ctx, tcg_vm);
    } else {
        TCGv_i32 tcg_vn = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_vm = tcg_temp_new_i32(tcg_ctx);

        read_vec_element_i32(s, tcg_vn, rn, 0, size);
        if (cmp_with_zero) {
            tcg_gen_movi_i32(tcg_ctx, tcg_vm, 0);
        } else {
            read_vec_element_i32(s, tcg_vm, rm, 0, size);
        }

        switch (size) {
        case MO_32:
            if (signal_all_nans) {
                gen_helper_vfp_cmpes_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            } else {
                gen_helper_vfp_cmps_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            }
            break;
        case MO_16:
            if (signal_all_nans) {
                gen_helper_vfp_cmpeh_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            } else {
                gen_helper_vfp_cmph_a64(tcg_ctx, tcg_flags, tcg_vn, tcg_vm, fpst);
            }
            break;
        default:
            g_assert_not_reached();
        }

        tcg_temp_free_i32(tcg_ctx, tcg_vn);
        tcg_temp_free_i32(tcg_ctx, tcg_vm);
    }

    tcg_temp_free_ptr(tcg_ctx, fpst);

    gen_set_nzcv(tcg_ctx, tcg_flags);

    tcg_temp_free_i64(tcg_ctx, tcg_flags);
}